

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O0

SinglyNodeWithRand * __thiscall
si9ma::SinglyLinkedList::get_prev(SinglyLinkedList *this,SinglyNodeWithRand *node)

{
  undefined8 *puVar1;
  bool bVar2;
  SinglyLinkedList *local_28;
  SinglyNodeWithRand *prev;
  SinglyNodeWithRand *node_local;
  SinglyLinkedList *this_local;
  
  if (this->size == 0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "linked list is empty";
    __cxa_throw(puVar1,&char_const*::typeinfo,0);
  }
  if (node == this->head) {
    this_local = (SinglyLinkedList *)0x0;
  }
  else {
    local_28 = (SinglyLinkedList *)this->head;
    while( true ) {
      bVar2 = false;
      if (local_28->head != node) {
        bVar2 = local_28 != (SinglyLinkedList *)this->tail;
      }
      if (!bVar2) break;
      local_28 = (SinglyLinkedList *)local_28->head;
    }
    if (local_28 == (SinglyLinkedList *)this->tail) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = "can not found prev";
      __cxa_throw(puVar1,&char_const*::typeinfo,0);
    }
    this_local = local_28;
  }
  return (SinglyNodeWithRand *)this_local;
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::get_prev(SinglyNodeWithRand *node) {
        if (size == 0)
            throw "linked list is empty";

        if (node == head)
            return nullptr;

        SinglyNodeWithRand *prev = head;
        while (prev->next != node && prev != tail)
            prev = prev->next;

        if (prev == tail)
            throw "can not found prev";

        return prev;
    }